

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcRelationship::~IfcRelationship(IfcRelationship *this)

{
  ~IfcRelationship((IfcRelationship *)&this[-1].super_IfcRoot.field_0x28);
  return;
}

Assistant:

IfcRelationship() : Object("IfcRelationship") {}